

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.h
# Opt level: O2

ComponentPtr __thiscall
Kompositum::buildComposite(Kompositum *this,IDType id,ParentChildTreeDef *treeMap)

{
  long lVar1;
  const_iterator cVar2;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var3;
  pointer *__ptr;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar4;
  __uniq_ptr_impl<Kompositum::Component,_std::default_delete<Kompositum::Component>_> local_48;
  long local_40;
  IDType local_38;
  
  local_38 = id;
  cVar2 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
          ::find(&treeMap->_M_t,&local_38);
  if ((_Rb_tree_header *)cVar2._M_node == &(treeMap->_M_t)._M_impl.super__Rb_tree_header) {
    make_unique<Kompositum::Leaf,unsigned_long&>((Kompositum *)&local_40,&local_38);
    *(long *)this = local_40;
  }
  else {
    make_unique<Kompositum::Composite,unsigned_long&>((Kompositum *)&local_40,&local_38);
    pVar4 = std::
            _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
            ::equal_range(&treeMap->_M_t,&local_38);
    for (_Var3 = pVar4.first._M_node; lVar1 = local_40,
        _Var3._M_node != pVar4.second._M_node._M_node;
        _Var3._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var3._M_node)) {
      buildComposite((Kompositum *)&local_48,(IDType)_Var3._M_node[1]._M_parent,treeMap);
      std::
      vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
      ::
      emplace_back<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>
                ((vector<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>,std::allocator<std::unique_ptr<Kompositum::Component,std::default_delete<Kompositum::Component>>>>
                  *)(lVar1 + 0x10),
                 (unique_ptr<Kompositum::Component,_std::default_delete<Kompositum::Component>_> *)
                 &local_48);
      if (local_48._M_t.
          super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
          .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
          0x0) {
        (**(code **)(*(long *)local_48._M_t.
                              super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>
                              .super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl +
                    8))();
      }
      local_48._M_t.
      super__Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>.
      super__Head_base<0UL,_Kompositum::Component_*,_false>._M_head_impl =
           (tuple<Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
           (_Tuple_impl<0UL,_Kompositum::Component_*,_std::default_delete<Kompositum::Component>_>)
           0x0;
    }
    *(long *)this = local_40;
  }
  return (__uniq_ptr_data<Kompositum::Component,_std::default_delete<Kompositum::Component>,_true,_true>
          )(__uniq_ptr_data<Kompositum::Component,_std::default_delete<Kompositum::Component>,_true,_true>
            )this;
}

Assistant:

ComponentPtr buildComposite(IDType id, const ParentChildTreeDef& treeMap) {
    const bool hasChildren = treeMap.find(id) != treeMap.end();
    if (hasChildren) {
        auto composite = make_unique<Composite>(id);

        auto range = treeMap.equal_range(id);
        for (auto child = range.first; child != range.second; ++child) {
            composite->addChild(buildComposite(child->second, treeMap));
        }

        return std::move(composite);
    }

    return make_unique<Leaf>(id);
}